

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O2

shared_ptr<QPDFObject> __thiscall
QPDFObject::create<QPDF_Real,double&,int&,bool&>
          (QPDFObject *this,double *args,int *args_1,bool *args_2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<QPDFObject> sVar1;
  string local_30;
  
  QUtil::double_to_string_abi_cxx11_
            (&local_30,(QUtil *)(ulong)(uint)*args_1,*args,(uint)*args_2,SUB81(args_2,0));
  std::make_shared<QPDFObject,QPDF_Real>((QPDF_Real *)this);
  std::__cxx11::string::~string((string *)&local_30);
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<QPDFObject>)sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<QPDFObject>
QPDFObject::create(Args&&... args)
{
    return std::make_shared<QPDFObject>(std::forward<T>(T(std::forward<Args>(args)...)));
}